

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall
cfd::core::Psbt::SetTxInRecord(Psbt *this,uint32_t index,ByteData *key,ByteData *value)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  _func_int **pp_Var6;
  uint64_t __n;
  CfdException *pCVar7;
  wally_tx *pwVar8;
  undefined4 in_register_00000034;
  wally_tx_witness_stack *pwVar9;
  wally_map *map_in;
  wally_psbt_input *parent;
  ulong __n_00;
  uint64_t uVar10;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  Transaction tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  wally_tx_witness_stack *stack;
  wally_tx *wally_tx_obj;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  int local_17c;
  undefined1 local_178 [16];
  wally_tx_witness_stack local_168;
  undefined1 local_148 [32];
  pointer pTStack_128;
  pointer local_120;
  pointer pTStack_118;
  pointer local_110;
  uchar *puStack_108;
  size_t local_100;
  uchar *puStack_f8;
  size_t local_f0;
  uchar *puStack_e8;
  size_t local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  ByteData local_c0;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  wally_tx_output *local_78;
  size_t local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x9dd,"SetTxInRecord");
  local_98._16_8_ = this->wally_psbt_pointer_;
  bVar3 = ByteData::IsEmpty(key);
  if (bVar3) {
    local_148._0_8_ = "cfdcore_psbt.cpp";
    local_148._8_4_ = 0x9e1;
    local_148._16_6_ = 0x5d8d07;
    local_148._22_2_ = 0;
    logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt empty key error.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"psbt empty key error.","");
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&local_60,key);
  ByteData::GetBytes(&local_d8,value);
  local_68 = (ulong)index * 0x110;
  parent = (wally_psbt_input *)(*(long *)(local_98._16_8_ + 0x10) + local_68);
  if (8 < *(byte *)(wally_map_item **)
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    pp_Var6 = (_func_int **)(local_148 + 0x10);
    local_148._16_6_ = 0x207475706e69;
    local_148._22_2_ = 0x6e75;
    local_148._24_6_ = 0x736e776f6e6b;
    local_148._8_8_ = (wally_tx_witness_stack *)0xe;
    local_148[0x1e] = '\0';
    local_148._0_8_ = pp_Var6;
    FindPsbtMap((core *)&parent->unknowns,
                (wally_map *)
                local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_148,(size_t *)0x0);
    if ((_func_int **)local_148._0_8_ != pp_Var6) {
      operator_delete((void *)local_148._0_8_);
    }
    local_17c = wally_map_add(&parent->unknowns,
                              local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_60.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_60.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                              local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x49f;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                        &local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var6;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt add input unknowns error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    goto LAB_0034c599;
  }
  lVar5 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  switch(*(byte *)(wally_map_item **)
                  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start) {
  case 0:
    if (lVar5 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x3df;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)local_178,&local_d8);
    Transaction::Transaction((Transaction *)local_148,(ByteData *)local_178);
    if ((wally_tx_witness_stack *)local_178._0_8_ != (wally_tx_witness_stack *)0x0) {
      operator_delete((void *)local_178._0_8_);
    }
    local_a8._0_8_ = (wally_tx *)0x0;
    AbstractTransaction::GetHex_abi_cxx11_((string *)local_178,(AbstractTransaction *)local_148);
    local_17c = wally_tx_from_hex((char *)local_178._0_8_,0,(wally_tx **)local_a8);
    if ((wally_tx_witness_stack *)local_178._0_8_ != &local_168) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 999;
      local_168.items = (wally_tx_witness_item *)0x5d933a;
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_tx_from_hex NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = &local_168;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt tx from hex error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((*(size_t *)(local_a8._0_8_ + 0x10) == 0) || (*(size_t *)(local_a8._0_8_ + 0x28) == 0)) {
      wally_tx_free((wally_tx *)local_a8._0_8_);
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x3ec;
      local_168.items = (wally_tx_witness_item *)0x5d933a;
      logger::log<>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                    "invalind utxo transaction format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = &local_168;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt invalid tx error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_utxo(parent,(wally_tx *)local_a8._0_8_);
    wally_tx_free((wally_tx *)local_a8._0_8_);
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x3f3;
      local_168.items = (wally_tx_witness_item *)0x5d933a;
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_psbt_input_set_utxo NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = &local_168;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt set input utxo error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Transaction::~Transaction((Transaction *)local_148);
    break;
  case 1:
    if (lVar5 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x3f9;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Deserializer::Deserializer((Deserializer *)local_178,&local_d8);
    pp_Var6 = (_func_int **)Deserializer::ReadUint64((Deserializer *)local_178);
    Deserializer::ReadVariableBuffer(&local_c0.data_,(Deserializer *)local_178);
    local_f0 = 0;
    puStack_e8 = (uchar *)0x0;
    local_100 = 0;
    puStack_f8 = (uchar *)0x0;
    local_110 = (pointer)0x0;
    puStack_108 = (uchar *)0x0;
    local_120 = (pointer)0x0;
    pTStack_118 = (pointer)0x0;
    local_148._24_6_ = 0;
    local_148[0x1e] = '\0';
    local_148[0x1f] = '\0';
    pTStack_128 = (pointer)0x0;
    local_e0 = 0;
    local_148._8_8_ =
         local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_148._16_6_ =
         (undefined6)
         ((long)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    local_148._22_2_ =
         (undefined2)
         ((ulong)((long)local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_c0.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 0x30);
    local_148._0_8_ = pp_Var6;
    local_17c = wally_psbt_input_set_witness_utxo(parent,(wally_tx_output *)local_148);
    if (local_17c != 0) {
      local_a8._0_8_ = "cfdcore_psbt.cpp";
      local_a8._8_4_ = 0x408;
      local_98._0_8_ = "SetPsbtInput";
      logger::log<int&>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,
                        "wally_psbt_input_set_witness_utxo NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a8._0_8_ = local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"psbt set output witnessUtxo error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_a8);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((wally_tx_witness_stack *)
        local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (wally_tx_witness_stack *)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_178._0_8_ = &PTR__Deserializer_0072e628;
    pwVar9 = (wally_tx_witness_stack *)local_178._8_8_;
    goto LAB_0034c58f;
  case 2:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,lVar5 - 1,
               (allocator_type *)local_148);
    if (local_178._8_8_ - local_178._0_8_ != 0) {
      memcpy((void *)local_178._0_8_,
             (void *)((long)(wally_map_item **)
                            local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1),
             local_178._8_8_ - local_178._0_8_);
    }
    ByteData::ByteData(&local_c0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178)
    ;
    Pubkey::Pubkey((Pubkey *)local_a8,&local_c0);
    if ((wally_tx_witness_stack *)
        local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (wally_tx_witness_stack *)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_148,(Pubkey *)local_a8);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_98 + 0x18),
                       (ByteData *)local_148);
    if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_148._0_8_);
    }
    pp_Var6 = (_func_int **)(local_148 + 0x10);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x10;
    local_148._0_8_ = pp_Var6;
    local_148._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_48);
    local_148._16_6_ =
         SUB86(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    local_148._22_2_ =
         (undefined2)
         ((ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 0x30);
    *(undefined8 *)local_148._0_8_ = 0x6973207475706e69;
    *(undefined8 *)(local_148._0_8_ + 8) = 0x7365727574616e67;
    local_148._8_8_ =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)(local_148._0_8_ +
             (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    FindPsbtMap((core *)&parent->signatures,(wally_map *)local_98._24_8_,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                (string *)local_148,(size_t *)0x0);
    if ((_func_int **)local_148._0_8_ != pp_Var6) {
      operator_delete((void *)local_148._0_8_);
    }
    local_17c = wally_map_add(&parent->signatures,(uchar *)local_98._24_8_,
                              (long)local_78 - local_98._24_8_,
                              local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x419;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                        &local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var6;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input signatures error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    goto LAB_0034c2e1;
  case 3:
    if (lVar5 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x41f;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((ulong)((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 4) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x424;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid value format.")
      ;
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid value format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_sighash
                          (parent,*(uint32_t *)
                                   local_d8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x42d;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_sighash NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input sighash error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 4:
    if (lVar5 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x433;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_redeem_script
                          (parent,local_d8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x43a;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_redeem_script NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input redeemScript error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 5:
    if (lVar5 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x440;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_witness_script
                          (parent,local_d8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x447;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_witness_script NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input witnessScript error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 6:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,lVar5 - 1,
               (allocator_type *)local_148);
    if (local_178._8_8_ - local_178._0_8_ != 0) {
      memcpy((void *)local_178._0_8_,
             (void *)((long)(wally_map_item **)
                            local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1),
             local_178._8_8_ - local_178._0_8_);
    }
    ByteData::ByteData(&local_c0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178)
    ;
    Pubkey::Pubkey((Pubkey *)local_a8,&local_c0);
    if ((wally_tx_witness_stack *)
        local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (wally_tx_witness_stack *)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_148,(Pubkey *)local_a8);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_98 + 0x18),
                       (ByteData *)local_148);
    if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_148._0_8_);
    }
    pp_Var6 = (_func_int **)(local_148 + 0x10);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x12;
    local_148._0_8_ = pp_Var6;
    local_148._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_48);
    local_148._16_6_ =
         SUB86(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    local_148._22_2_ =
         (undefined2)
         ((ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 0x30);
    *(undefined8 *)local_148._0_8_ = 0x6962207475706e69;
    *(undefined8 *)(local_148._0_8_ + 8) = 0x6b62757020323370;
    *(undefined2 *)(local_148._0_8_ + 0x10) = 0x7965;
    local_148._8_8_ =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)(local_148._0_8_ +
             (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    FindPsbtMap((core *)&parent->keypaths,(wally_map *)local_98._24_8_,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                (string *)local_148,(size_t *)0x0);
    if ((_func_int **)local_148._0_8_ != pp_Var6) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((ulong)((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 4) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x455;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid value format.")
      ;
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var6;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid value format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __n_00 = ((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) - 4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_48,__n_00 >> 2,(allocator_type *)local_148);
    if (__n_00 != 0) {
      memcpy(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (uint32_t *)
             ((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 4),__n_00);
    }
    local_17c = wally_map_add_keypath_item
                          (&parent->keypaths,(uchar *)local_98._24_8_,
                           (long)local_78 - local_98._24_8_,
                           local_d8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,4,
                           local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           (long)local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x463;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_map_add_keypath_item NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var6;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input pubkey error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((wally_tx_witness_stack *)
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (wally_tx_witness_stack *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
LAB_0034c2e1:
    if ((wally_map *)local_98._24_8_ != (wally_map *)0x0) {
      operator_delete((void *)local_98._24_8_);
    }
    pwVar9 = (wally_tx_witness_stack *)local_178._0_8_;
    if ((wally_tx *)local_a8._0_8_ != (wally_tx *)0x0) {
      operator_delete((void *)local_a8._0_8_);
      pwVar9 = (wally_tx_witness_stack *)local_178._0_8_;
    }
    goto LAB_0034c58f;
  case 7:
    if (lVar5 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x469;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_final_scriptsig
                          (parent,local_d8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x470;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_final_scriptsig NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input final scriptsig error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 8:
    if (lVar5 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x476;
      local_148._16_6_ = 0x5d933a;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Deserializer::Deserializer((Deserializer *)local_148,&local_d8);
    __n = Deserializer::ReadVariableInt((Deserializer *)local_148);
    ::std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_a8,__n,(allocator_type *)local_178);
    if (__n != 0) {
      lVar5 = 0;
      uVar10 = __n;
      do {
        Deserializer::ReadVariableBuffer
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,
                   (Deserializer *)local_148);
        pvVar2 = *(void **)(local_a8._0_8_ + lVar5);
        *(undefined8 *)(local_a8._0_8_ + lVar5) = local_178._0_8_;
        *(undefined8 *)((pointer)(local_a8._0_8_ + lVar5) + 8) = local_178._8_8_;
        *(wally_tx_witness_item **)(local_a8._0_8_ + lVar5 + 0x10) = local_168.items;
        local_178._0_8_ = (wally_tx_witness_stack *)0x0;
        local_178._8_8_ = (wally_tx_witness_stack *)0x0;
        local_168.items = (wally_tx_witness_item *)0x0;
        if ((pvVar2 != (void *)0x0) &&
           (operator_delete(pvVar2),
           (wally_tx_witness_stack *)local_178._0_8_ != (wally_tx_witness_stack *)0x0)) {
          operator_delete((void *)local_178._0_8_);
        }
        lVar5 = lVar5 + 0x18;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_17c = wally_tx_witness_stack_init_alloc(__n,(wally_tx_witness_stack **)&local_c0);
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x484;
      local_168.items = (wally_tx_witness_item *)0x5d933a;
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_tx_witness_stack_init_alloc NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = &local_168;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt alloc witness stack error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    for (pwVar8 = (wally_tx *)local_a8._0_8_; local_17c = 0,
        pwVar8 != (wally_tx *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
        pwVar8 = (wally_tx *)&pwVar8->inputs_allocation_len) {
      local_17c = wally_tx_witness_stack_add
                            ((wally_tx_witness_stack *)
                             local_c0.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,*(uchar **)pwVar8,
                             (long)pwVar8->inputs - (long)*(uchar **)pwVar8);
      if (local_17c != 0) {
        wally_tx_witness_stack_free
                  ((wally_tx_witness_stack *)
                   local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        local_178._0_8_ = "cfdcore_psbt.cpp";
        local_178._8_4_ = 0x48d;
        local_168.items = (wally_tx_witness_item *)0x5d933a;
        logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                          "wally_tx_witness_stack_add NG[{}]",&local_17c);
        pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
        local_178._0_8_ = &local_168;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"psbt add witness stack error.","");
        CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_178);
        __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    local_17c = wally_psbt_input_set_final_witness
                          (parent,(wally_tx_witness_stack *)
                                  local_c0.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    wally_tx_witness_stack_free
              ((wally_tx_witness_stack *)
               local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x495;
      local_168.items = (wally_tx_witness_item *)0x5d933a;
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_psbt_input_set_final_witness NG[{}]",&local_17c);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = &local_168;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt set input final witnessStack error.","");
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_a8);
    local_148._0_8_ = &PTR__Deserializer_0072e628;
    pwVar9 = (wally_tx_witness_stack *)local_148._8_8_;
LAB_0034c58f:
    if (pwVar9 != (wally_tx_witness_stack *)0x0) {
      operator_delete(pwVar9);
    }
  }
LAB_0034c599:
  bVar1 = *(byte *)(wally_map_item **)
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (bVar1 < 9) {
    if (bVar1 == 6) {
      map_in = (wally_map *)(*(long *)(local_98._16_8_ + 0x10) + local_68 + 0x48);
    }
    else {
      if (bVar1 != 2) goto LAB_0034c61e;
      map_in = (wally_map *)(*(long *)(local_98._16_8_ + 0x10) + local_68 + 0x60);
    }
  }
  else {
    map_in = (wally_map *)(*(long *)(local_98._16_8_ + 0x10) + local_68 + 0x78);
  }
  iVar4 = wally_map_sort(map_in,0);
  local_178._0_4_ = iVar4;
  if (iVar4 != 0) {
    local_148._0_8_ = "cfdcore_psbt.cpp";
    local_148._8_4_ = 0x9f6;
    local_148._16_6_ = 0x5d8d07;
    local_148._22_2_ = 0;
    logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                      (int *)local_178);
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"psbt input sort unknowns error.","");
    CfdException::CfdException(pCVar7,kCfdInternalError,(string *)local_148);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
LAB_0034c61e:
  if ((uint32_t *)
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((wally_map *)
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (wally_map *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Psbt::SetTxInRecord(
    uint32_t index, const ByteData &key, const ByteData &value) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }

  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();
  uint8_t type = SetPsbtInput(key_vec, val_vec, &psbt_pointer->inputs[index]);

  struct wally_map *map_ptr = nullptr;
  if (type <= Psbt::kPsbtInputFinalScriptWitness) {
    if (type == Psbt::kPsbtInputPartialSig) {
      map_ptr = &psbt_pointer->inputs[index].signatures;
    } else if (type == Psbt::kPsbtInputBip32Derivation) {
      map_ptr = &psbt_pointer->inputs[index].keypaths;
    }
  } else {
    map_ptr = &psbt_pointer->inputs[index].unknowns;
  }
  if (map_ptr != nullptr) {
    int ret = wally_map_sort(map_ptr, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt input sort unknowns error.");
    }
  }
}